

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O1

bool __thiscall lan::db::iterate<int>(db *this,string *target,int value,db_bit_type type)

{
  pointer pcVar1;
  db_bit *context;
  string *psVar2;
  bool bVar3;
  db_bits *pdVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  invalid_argument *this_00;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pcVar1 = (target->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + target->_M_string_length);
  pdVar4 = find_rec(this,&local_b0,Container,Array,this->first);
  this->data = pdVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (pdVar4 == (db_bits *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_70,target,"{a}");
    error_string(&local_50,this,_bit_name_error,&local_70);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_50);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  context = this->data;
  if (context->lin == (db_bit *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    bVar3 = init_iter<int>(this,context,&local_d0,value,type);
    psVar2 = &local_d0;
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    bVar3 = append_iter<int>(this,context,&local_90,value,type);
    psVar2 = &local_90;
  }
  paVar5 = &psVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar5->_M_allocated_capacity)[-2] != paVar5) {
    operator_delete((undefined1 *)(&paVar5->_M_allocated_capacity)[-2],
                    paVar5->_M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool iterate(std::string const target, any const value, db_bit_type const type){
            if((data = find_rec(target, lan::Container, lan::Array, first))) {
                return (data->lin) ? append_iter(data, "", value, type) :
                init_iter(data, "", value, type);
            } throw lan::errors::bit_name_error(error_string(errors::_private::_bit_name_error, target+"{a}"));
        }